

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O3

bool dxil_spv::emit_isfinite_instruction(Impl *impl,CallInst *instruction)

{
  Id IVar1;
  Builder *this;
  Operation *pOVar2;
  Operation *this_00;
  Value *pVVar3;
  Operation *this_01;
  Id local_40;
  Id local_3c;
  initializer_list<unsigned_int> local_38;
  
  this = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeBoolType(this);
  pOVar2 = Converter::Impl::allocate(impl,OpIsNan,IVar1);
  IVar1 = spv::Builder::makeBoolType(this);
  this_00 = Converter::Impl::allocate(impl,OpIsInf,IVar1);
  pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
  Operation::add_id(pOVar2,IVar1);
  pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
  Operation::add_id(this_00,IVar1);
  Converter::Impl::add(impl,pOVar2,false);
  Converter::Impl::add(impl,this_00,false);
  IVar1 = spv::Builder::makeBoolType(this);
  this_01 = Converter::Impl::allocate(impl,OpLogicalOr,IVar1);
  local_40 = pOVar2->id;
  local_38._M_array = &local_40;
  local_3c = this_00->id;
  local_38._M_len = 2;
  Operation::add_ids(this_01,&local_38);
  Converter::Impl::add(impl,this_01,false);
  pOVar2 = Converter::Impl::allocate(impl,OpLogicalNot,(Value *)instruction);
  Operation::add_id(pOVar2,this_01->id);
  Converter::Impl::add(impl,pOVar2,false);
  return true;
}

Assistant:

bool emit_isfinite_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	// There is an OpIsFinite instruction, but it's only supported in kernel mode, so we have to decompose here.

	Operation *nan_op = impl.allocate(spv::OpIsNan, builder.makeBoolType());
	Operation *inf_op = impl.allocate(spv::OpIsInf, builder.makeBoolType());
	nan_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
	inf_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));

	impl.add(nan_op);
	impl.add(inf_op);

	Operation *non_finite_op = impl.allocate(spv::OpLogicalOr, builder.makeBoolType());
	non_finite_op->add_ids({ nan_op->id, inf_op->id });
	impl.add(non_finite_op);

	Operation *op = impl.allocate(spv::OpLogicalNot, instruction);
	op->add_id(non_finite_op->id);
	impl.add(op);
	return true;
}